

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase107::run(TestCase107 *this)

{
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ReaderOptions options;
  DebugExpression<bool> _kjCondition;
  Fault f;
  ArrayPtr<const_capnp::word> segments [1];
  AlignedData<4> nonNullEmptyStruct;
  SegmentArrayMessageReader messageReader;
  DebugExpression<bool> local_121;
  Fault local_120;
  ArrayPtr<const_capnp::word> local_118;
  word local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  SegmentArrayMessageReader local_e8;
  
  local_118.ptr = &local_108;
  local_f8 = 0xfffffffc;
  uStack_f0 = 0xeeeeeeeeeeeeeeee;
  local_108.content = 0x2000000000000;
  uStack_100 = 0x100000004;
  local_118.size_ = 4;
  segments_00.size_ = 1;
  segments_00.ptr = &local_118;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  SegmentArrayMessageReader::SegmentArrayMessageReader(&local_e8,segments_00,options);
  local_121.value = MessageReader::isCanonical(&local_e8.super_MessageReader);
  if (local_121.value) {
    SegmentArrayMessageReader::~SegmentArrayMessageReader(&local_e8);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            (&local_120,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/canonicalize-test.c++"
             ,0x7c,FAILED,"messageReader.isCanonical()","_kjCondition,",&local_121);
  kj::_::Debug::Fault::fatal(&local_120);
}

Assistant:

TEST(Encoding, DefaultsFromEmptyMessage) {
  AlignedData<1> emptyMessage = {{0, 0, 0, 0, 0, 0, 0, 0}};

  kj::ArrayPtr<const word> segments[1] = {kj::arrayPtr(emptyMessage.words, 1)};
  SegmentArrayMessageReader reader(kj::arrayPtr(segments, 1));

  checkTestMessage(reader.getRoot<TestDefaults>());
  checkTestMessage(readMessageUnchecked<TestDefaults>(emptyMessage.words));
}